

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

GLFWvidmode * glfwGetVideoModes(GLFWmonitor *handle,int *count)

{
  int iVar1;
  _GLFWmonitor *monitor;
  int *count_local;
  GLFWmonitor *handle_local;
  
  *count = 0;
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    handle_local = (GLFWmonitor *)0x0;
  }
  else {
    iVar1 = refreshVideoModes((_GLFWmonitor *)handle);
    if (iVar1 == 0) {
      handle_local = (GLFWmonitor *)0x0;
    }
    else {
      *count = *(int *)(handle + 0x18);
      handle_local = *(GLFWmonitor **)(handle + 0x10);
    }
  }
  return (GLFWvidmode *)handle_local;
}

Assistant:

GLFWAPI const GLFWvidmode* glfwGetVideoModes(GLFWmonitor* handle, int* count)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!refreshVideoModes(monitor))
        return NULL;

    *count = monitor->modeCount;
    return monitor->modes;
}